

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

QPlainTextEdit * __thiscall QPlainTextEdit::cursorForPosition(QPlainTextEdit *this,QPoint *pos)

{
  long lVar1;
  QPlainTextEditControl *pos_00;
  QPoint *in_RDX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos_00 = *(QPlainTextEditControl **)((long)pos[1] + 800);
  QPlainTextEditPrivate::mapToContents((QPlainTextEditPrivate *)pos[1],in_RDX);
  QWidgetTextControl::cursorForPosition((QWidgetTextControl *)this,(QPointF *)pos_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextCursor QPlainTextEdit::cursorForPosition(const QPoint &pos) const
{
    Q_D(const QPlainTextEdit);
    return d->control->cursorForPosition(d->mapToContents(pos));
}